

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

bool __thiscall QMakeEvaluator::isActiveConfig(QMakeEvaluator *this,QStringView config,bool regex)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  QString *pQVar4;
  byte in_CL;
  QMakeEvaluator *in_RDI;
  long in_FS_OFFSET;
  ProString *configValue;
  ProStringList *__range2;
  ProStringRoUser u1;
  const_iterator __end2;
  const_iterator __begin2;
  ProStringList configValues;
  QRegularExpression re;
  undefined4 in_stack_fffffffffffffe88;
  CaseSensitivity in_stack_fffffffffffffe8c;
  undefined6 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe96;
  undefined1 in_stack_fffffffffffffe97;
  QString *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  undefined8 in_stack_fffffffffffffea8;
  QChar c;
  undefined4 in_stack_fffffffffffffeb0;
  CaseSensitivity in_stack_fffffffffffffeb4;
  uint uVar5;
  byte local_119;
  QStringView in_stack_ffffffffffffff00;
  undefined4 local_dc;
  QRegularExpressionMatch local_d8 [8];
  ProStringRoUser local_d0;
  ProString *local_c8;
  const_iterator local_c0;
  const_iterator local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_94;
  QRegularExpressionMatch local_90 [40];
  CaseSensitivity local_68;
  QFlags_conflict *local_60;
  undefined8 local_58;
  QLatin1Char local_4f [4];
  QLatin1Char local_4b [67];
  long local_8;
  
  c.ucs = (char16_t)((ulong)in_stack_fffffffffffffea8 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe98);
  bVar1 = ::operator==((QStringView *)
                       CONCAT17(in_stack_fffffffffffffe97,
                                CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)),
                       (QStringView *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))
  ;
  if (bVar1) {
    local_119 = 1;
    goto LAB_002f6459;
  }
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe98);
  bVar1 = ::operator==((QStringView *)
                       CONCAT17(in_stack_fffffffffffffe97,
                                CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)),
                       (QStringView *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))
  ;
  if (bVar1) {
    local_119 = 0;
    goto LAB_002f6459;
  }
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe98);
  bVar1 = ::operator==((QStringView *)
                       CONCAT17(in_stack_fffffffffffffe97,
                                CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)),
                       (QStringView *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))
  ;
  if (bVar1) {
    local_119 = in_RDI->m_hostBuild & 1;
    goto LAB_002f6459;
  }
  if ((in_CL & 1) == 0) {
LAB_002f63ab:
    QStringView::QStringView<QString,_true>
              ((QStringView *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe98);
    bVar1 = ::operator==((QStringView *)
                         CONCAT17(in_stack_fffffffffffffe97,
                                  CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)),
                         (QStringView *)
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (bVar1) {
      local_119 = 1;
      goto LAB_002f6459;
    }
    values(in_RDI,(ProKey *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    bVar3 = ProStringList::contains
                      ((ProStringList *)in_RDI,in_stack_ffffffffffffff00,in_stack_fffffffffffffeb4);
    ProStringList::~ProStringList((ProStringList *)0x2f6441);
    if ((bVar3 & 1) != 0) {
      local_119 = 1;
      goto LAB_002f6459;
    }
  }
  else {
    QLatin1Char::QLatin1Char(local_4b,'*');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)CONCAT17(in_stack_fffffffffffffe97,
                                 CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)),
               (QLatin1Char)(char)((ulong)in_stack_fffffffffffffe98 >> 0x38));
    bVar1 = QStringView::contains
                      ((QStringView *)
                       CONCAT17(in_stack_fffffffffffffe97,
                                CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)),c,
                       in_stack_fffffffffffffe8c);
    if (!bVar1) {
      QLatin1Char::QLatin1Char(local_4f,'?');
      QChar::QChar<QLatin1Char,_true>
                ((QChar *)CONCAT17(in_stack_fffffffffffffe97,
                                   CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)),
                 (QLatin1Char)(char)((ulong)in_stack_fffffffffffffe98 >> 0x38));
      bVar1 = QStringView::contains
                        ((QStringView *)
                         CONCAT17(in_stack_fffffffffffffe97,
                                  CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)),c,
                         in_stack_fffffffffffffe8c);
      if (!bVar1) goto LAB_002f63ab;
    }
    local_58 = 0xaaaaaaaaaaaaaaaa;
    QStringView::toString
              ((QStringView *)
               CONCAT17(in_stack_fffffffffffffe97,
                        CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)));
    QStringView::QStringView<QString,_true>
              ((QStringView *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe98);
    QFlags<QRegularExpression::WildcardConversionOption>::QFlags
              ((QFlags<QRegularExpression::WildcardConversionOption> *)
               CONCAT17(in_stack_fffffffffffffe97,
                        CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)),
               in_stack_fffffffffffffe8c);
    QRegularExpression::fromWildcard((QStringView *)&local_58,local_68,local_60);
    QString::~QString((QString *)0x2f611f);
    pQVar4 = &in_RDI->m_qmakespecName;
    QFlags<QRegularExpression::MatchOption>::QFlags
              ((QFlags<QRegularExpression::MatchOption> *)
               CONCAT17(in_stack_fffffffffffffe97,
                        CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)),
               in_stack_fffffffffffffe8c);
    QRegularExpression::match(local_90,&local_58,pQVar4,0,0,local_94);
    uVar2 = QRegularExpressionMatch::hasMatch();
    uVar5 = CONCAT13(uVar2,(int3)in_stack_fffffffffffffeb4);
    QRegularExpressionMatch::~QRegularExpressionMatch(local_90);
    if ((uVar5 & 0x1000000) == 0) {
      local_b0 = 0xaaaaaaaaaaaaaaaa;
      local_a8 = 0xaaaaaaaaaaaaaaaa;
      local_a0 = 0xaaaaaaaaaaaaaaaa;
      values(in_RDI,(ProKey *)CONCAT44(uVar5,in_stack_fffffffffffffeb0));
      local_b8.i = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_b8 = QList<ProString>::begin
                           ((QList<ProString> *)
                            CONCAT17(in_stack_fffffffffffffe97,
                                     CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)))
      ;
      local_c0.i = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_c0 = QList<ProString>::end
                           ((QList<ProString> *)
                            CONCAT17(in_stack_fffffffffffffe97,
                                     CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)))
      ;
      while( true ) {
        local_c8 = local_c0.i;
        bVar1 = QList<ProString>::const_iterator::operator!=(&local_b8,local_c0);
        if (!bVar1) break;
        QList<ProString>::const_iterator::operator*(&local_b8);
        local_d0.m_rs = (QString *)0xaaaaaaaaaaaaaaaa;
        in_RDI->m_toggle = in_RDI->m_toggle ^ 1;
        ProStringRoUser::ProStringRoUser
                  ((ProStringRoUser *)
                   CONCAT17(in_stack_fffffffffffffe97,
                            CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)),
                   (ProString *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   (QString *)0x2f62e0);
        pQVar4 = ProStringRoUser::str(&local_d0);
        QFlags<QRegularExpression::MatchOption>::QFlags
                  ((QFlags<QRegularExpression::MatchOption> *)
                   CONCAT17(in_stack_fffffffffffffe97,
                            CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)),
                   in_stack_fffffffffffffe8c);
        QRegularExpression::match(local_d8,&local_58,pQVar4,0,0,local_dc);
        bVar3 = QRegularExpressionMatch::hasMatch();
        QRegularExpressionMatch::~QRegularExpressionMatch(local_d8);
        if ((bVar3 & 1) != 0) {
          local_119 = 1;
          bVar1 = true;
          goto LAB_002f637d;
        }
        QList<ProString>::const_iterator::operator++(&local_b8);
      }
      bVar1 = false;
LAB_002f637d:
      ProStringList::~ProStringList((ProStringList *)0x2f638a);
    }
    else {
      local_119 = 1;
      bVar1 = true;
    }
    QRegularExpression::~QRegularExpression((QRegularExpression *)&local_58);
    if (bVar1) goto LAB_002f6459;
  }
  local_119 = 0;
LAB_002f6459:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_119 & 1);
}

Assistant:

bool QMakeEvaluator::isActiveConfig(QStringView config, bool regex)
{
    // magic types for easy flipping
    if (config == statics.strtrue)
        return true;
    if (config == statics.strfalse)
        return false;

    if (config == statics.strhost_build)
        return m_hostBuild;

    if (regex && (config.contains(QLatin1Char('*')) || config.contains(QLatin1Char('?')))) {
        auto re = QRegularExpression::fromWildcard(config.toString());

        // mkspecs
        if (re.match(m_qmakespecName).hasMatch())
            return true;

        // CONFIG variable
        const auto configValues = values(statics.strCONFIG);
        for (const ProString &configValue : configValues) {
            ProStringRoUser u1(configValue, m_tmp[m_toggle ^= 1]);
            if (re.match(u1.str()).hasMatch())
                return true;
        }
    } else {
        // mkspecs
        if (m_qmakespecName == config)
            return true;

        // CONFIG variable
        if (values(statics.strCONFIG).contains(config))
            return true;
    }

    return false;
}